

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDofsImport.cpp
# Opt level: O0

bool iDynTree::dofsListFromURDF
               (string *urdf_filename,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dofs)

{
  byte bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  string *in_RDI;
  string xml_string;
  ifstream ifs;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  istream_type *in_stack_fffffffffffffd68;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd70;
  allocator<char> local_271 [9];
  allocator<char> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffda8;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffdb8;
  undefined1 local_220 [392];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  bool local_1;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar2,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "[ERROR] iDynTree::dofsFromURDF : error opening file ");
    poVar3 = std::operator<<(poVar3,in_RDI);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffda8,
               in_stack_fffffffffffffd98);
    std::allocator<char>::~allocator(local_271);
    local_1 = dofsListFromURDFString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  }
  std::ifstream::~ifstream(local_220);
  return local_1;
}

Assistant:

bool dofsListFromURDF(const std::string & urdf_filename,
                      std::vector<std::string>& dofs)
{
    std::ifstream ifs(urdf_filename.c_str());

    if( !ifs.is_open() )
    {
        std::cerr << "[ERROR] iDynTree::dofsFromURDF : error opening file "
                  << urdf_filename << std::endl;
        return false;
    }

    std::string xml_string( (std::istreambuf_iterator<char>(ifs) ),
                            (std::istreambuf_iterator<char>()    ) );

    return dofsListFromURDFString(xml_string,dofs);
}